

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::NavigationBar::showNextScreen(NavigationBar *this)

{
  NavigationBarPrivate *pNVar1;
  Type *text;
  Data *dd;
  QStackedWidget *pQVar2;
  Data *dd_00;
  Data *dd_01;
  int t;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar3;
  QWidget *local_38;
  
  pNVar1 = (this->d).d;
  if ((pNVar1->forwardStack).super_QList<int>.d.size != 0) {
    QStack<int>::pop(&pNVar1->forwardStack);
    pNVar1 = (this->d).d;
    local_38 = (QWidget *)QStackedWidget::widget((int)pNVar1->stack);
    pQVar3 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&pNVar1->itemsMap,&local_38);
    text = pQVar3->value;
    dd = pQVar3->d;
    if (dd != (Data *)0x0) {
      LOCK();
      (dd->weakref)._q_value.super___atomic_base<int>._M_i =
           (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (dd->strongref)._q_value.super___atomic_base<int>._M_i =
           (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pNVar1 = (this->d).d;
    pQVar2 = pNVar1->stack;
    currentIndex(this);
    local_38 = (QWidget *)QStackedWidget::widget((int)pQVar2);
    pQVar3 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&pNVar1->itemsMap,&local_38);
    dd_00 = pQVar3->d;
    if (dd_00 != (Data *)0x0) {
      LOCK();
      (dd_00->weakref)._q_value.super___atomic_base<int>._M_i =
           (dd_00->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (dd_00->strongref)._q_value.super___atomic_base<int>._M_i =
           (dd_00->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pNVar1 = (this->d).d;
    t = currentIndex(this);
    QList<int>::append(&(pNVar1->backStack).super_QList<int>,t);
    TextLabel::setText(((this->d).d)->title,&text->title);
    QAbstractButton::setText((QString *)((this->d).d)->left);
    QWidget::show();
    QStackedWidget::setCurrentWidget((QWidget *)((this->d).d)->stack);
    pNVar1 = (this->d).d;
    if ((pNVar1->forwardStack).super_QList<int>.d.size == 0) {
      QWidget::hide();
    }
    else {
      pQVar2 = pNVar1->stack;
      QStack<int>::top(&pNVar1->forwardStack);
      local_38 = (QWidget *)QStackedWidget::widget((int)pQVar2);
      pQVar3 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                         (&pNVar1->itemsMap,&local_38);
      dd_01 = pQVar3->d;
      if (dd_01 != (Data *)0x0) {
        LOCK();
        (dd_01->weakref)._q_value.super___atomic_base<int>._M_i =
             (dd_01->weakref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (dd_01->strongref)._q_value.super___atomic_base<int>._M_i =
             (dd_01->strongref)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QAbstractButton::setText((QString *)((this->d).d)->right);
      QSharedPointer<QtMWidgets::NavigationItem>::deref(dd_01);
    }
    QSharedPointer<QtMWidgets::NavigationItem>::deref(dd_00);
    QSharedPointer<QtMWidgets::NavigationItem>::deref(dd);
  }
  return;
}

Assistant:

void
NavigationBar::showNextScreen()
{
	if( !d->forwardStack.isEmpty() )
	{
		const int nextIndex = d->forwardStack.pop();
		QSharedPointer< NavigationItem > nextItem =
			d->itemsMap[ d->stack->widget( nextIndex ) ];
		QSharedPointer< NavigationItem > currentItem =
			d->itemsMap[ d->stack->widget( currentIndex() ) ];

		d->backStack.push( currentIndex() );

		d->title->setText( nextItem->title );

		d->left->setText( currentItem->title );
		d->left->show();

		d->stack->setCurrentWidget( nextItem->self );

		if( !d->forwardStack.isEmpty() )
		{
			QSharedPointer< NavigationItem > item =
				d->itemsMap[ d->stack->widget( d->forwardStack.top() ) ];

			d->right->setText( item->title );
		}
		else
			d->right->hide();
	}
}